

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O2

void __thiscall t_json_generator::write_type_spec(t_json_generator *this,t_type *ttype)

{
  t_type *ttype_00;
  int iVar1;
  t_type *ptVar2;
  _Base_ptr p_Var3;
  char *pcVar4;
  string *this_00;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ptVar2 = t_type::get_true_type(ttype);
  get_type_name_abi_cxx11_(&local_1f0,(t_json_generator *)ttype,ptVar2);
  write_string(this,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  if ((ptVar2->annotations_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__cxx11::string::string((string *)&local_90,"annotations",(allocator *)&local_1f0);
    write_key_and(this,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    start_object(this,true);
    for (p_Var3 = (ptVar2->annotations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(ptVar2->annotations_)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      std::__cxx11::string::string((string *)&local_50,(string *)(p_Var3 + 1));
      std::__cxx11::string::string((string *)&local_70,(string *)(p_Var3 + 2));
      write_key_and_string(this,&local_50,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
    }
    end_object(this);
  }
  iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xb])(ptVar2);
  if (((char)iVar1 == '\0') &&
     (iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xc])(ptVar2), (char)iVar1 == '\0')) {
    iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0x10])(ptVar2);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xe])(ptVar2);
      if ((char)iVar1 == '\0') {
        iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xf])(ptVar2);
        if ((char)iVar1 == '\0') {
          return;
        }
        ptVar2 = *(t_type **)&ptVar2[1].super_t_doc.has_doc_;
        pcVar4 = "elemTypeId";
        std::__cxx11::string::string((string *)&local_1b0,"elemTypeId",(allocator *)&local_1f0);
        get_type_name_abi_cxx11_(&local_1d0,(t_json_generator *)pcVar4,ptVar2);
        write_key_and_string(this,&local_1b0,&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        this_00 = &local_1b0;
      }
      else {
        ptVar2 = *(t_type **)&ptVar2[1].super_t_doc.has_doc_;
        pcVar4 = "elemTypeId";
        std::__cxx11::string::string((string *)&local_170,"elemTypeId",(allocator *)&local_1f0);
        get_type_name_abi_cxx11_(&local_190,(t_json_generator *)pcVar4,ptVar2);
        write_key_and_string(this,&local_170,&local_190);
        std::__cxx11::string::~string((string *)&local_190);
        this_00 = &local_170;
      }
      std::__cxx11::string::~string((string *)this_00);
      pcVar4 = "elemType";
    }
    else {
      ttype_00 = *(t_type **)&ptVar2[1].super_t_doc.has_doc_;
      ptVar2 = *(t_type **)&ptVar2[1].annotations_._M_t._M_impl;
      pcVar4 = "keyTypeId";
      std::__cxx11::string::string((string *)&local_f0,"keyTypeId",(allocator *)&local_1f0);
      get_type_name_abi_cxx11_(&local_110,(t_json_generator *)pcVar4,ttype_00);
      write_key_and_string(this,&local_f0,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_f0);
      pcVar4 = "valueTypeId";
      std::__cxx11::string::string((string *)&local_130,"valueTypeId",(allocator *)&local_1f0);
      get_type_name_abi_cxx11_(&local_150,(t_json_generator *)pcVar4,ptVar2);
      write_key_and_string(this,&local_130,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_130);
      write_type_spec_object(this,"keyType",ttype_00);
      pcVar4 = "valueType";
    }
    write_type_spec_object(this,pcVar4,ptVar2);
    return;
  }
  std::__cxx11::string::string((string *)&local_b0,"class",(allocator *)&local_1f0);
  get_qualified_name_abi_cxx11_(&local_d0,this,ptVar2);
  write_key_and_string(this,&local_b0,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

void t_json_generator::write_type_spec(t_type* ttype) {
  ttype = ttype->get_true_type();

  write_string(get_type_name(ttype));

  if (ttype->annotations_.size() > 0) {
    write_key_and("annotations");
    start_object();
    for (auto & annotation : ttype->annotations_) {
      write_key_and_string(annotation.first, annotation.second);
    }
    end_object();
  }

  if (ttype->is_struct() || ttype->is_xception()) {
    write_key_and_string("class", get_qualified_name(ttype));
  } else if (ttype->is_map()) {
    t_type* ktype = ((t_map*)ttype)->get_key_type();
    t_type* vtype = ((t_map*)ttype)->get_val_type();
    write_key_and_string("keyTypeId", get_type_name(ktype));
    write_key_and_string("valueTypeId", get_type_name(vtype));
    write_type_spec_object("keyType", ktype);
    write_type_spec_object("valueType", vtype);
  } else if (ttype->is_list()) {
    t_type* etype = ((t_list*)ttype)->get_elem_type();
    write_key_and_string("elemTypeId", get_type_name(etype));
    write_type_spec_object("elemType", etype);
  } else if (ttype->is_set()) {
    t_type* etype = ((t_set*)ttype)->get_elem_type();
    write_key_and_string("elemTypeId", get_type_name(etype));
    write_type_spec_object("elemType", etype);
  }
}